

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# span_test.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_0::SpanDeathTest_BoundsChecks_Test::TestBody
          (SpanDeathTest_BoundsChecks_Test *this)

{
  bool bVar1;
  int iVar2;
  uint uVar3;
  char *pcVar4;
  char *regex;
  char *regex_00;
  char *regex_01;
  char *regex_02;
  char *regex_03;
  char *regex_04;
  char *regex_05;
  Span<const_int> SVar5;
  Span<const_int> SVar6;
  Span<const_int> SVar7;
  AssertHelper local_368;
  Message local_360 [6];
  exception *gtest_exception_6;
  ReturnSentinel gtest_sentinel_6;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr_6;
  pointer local_308;
  DeathTest *gtest_dt_6;
  Message local_2f8 [6];
  exception *gtest_exception_5;
  ReturnSentinel gtest_sentinel_5;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr_5;
  pointer local_2a0;
  DeathTest *gtest_dt_5;
  Message local_290 [6];
  exception *gtest_exception_4;
  ReturnSentinel gtest_sentinel_4;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr_4;
  pointer local_238;
  DeathTest *gtest_dt_4;
  Span<const_int> empty;
  Message local_218 [6];
  exception *gtest_exception_3;
  size_t local_1e0;
  ReturnSentinel local_1d8;
  ReturnSentinel gtest_sentinel_3;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr_3;
  pointer local_1b0;
  DeathTest *gtest_dt_3;
  Message local_1a0 [6];
  exception *gtest_exception_2;
  size_t local_168;
  ReturnSentinel local_160;
  ReturnSentinel gtest_sentinel_2;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr_2;
  pointer local_138;
  DeathTest *gtest_dt_2;
  Message local_128 [6];
  exception *gtest_exception_1;
  size_t local_f0;
  ReturnSentinel local_e8;
  ReturnSentinel gtest_sentinel_1;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr_1;
  pointer local_c0;
  DeathTest *gtest_dt_1;
  Message local_b0;
  int local_a4;
  exception *gtest_exception;
  ReturnSentinel gtest_sentinel;
  unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  gtest_dt_ptr;
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
  local_58;
  pointer local_40;
  DeathTest *gtest_dt;
  Span<const_int> span;
  int v [4];
  SpanDeathTest_BoundsChecks_Test *this_local;
  
  span.size_ = 0x200000001;
  Span<const_int>::Span((Span<const_int> *)&gtest_dt,(int *)&span.size_,3);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_(&local_58,(internal *)0x4e061d,regex);
    bVar1 = testing::internal::DeathTest::Create
                      ("span[3]",&local_58,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/span_test.cc"
                       ,0x6b,&local_40);
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher(&local_58);
    if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_00155cb2;
    if (local_40 != (pointer)0x0) {
      std::
      unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
      unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
                ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
                  *)&gtest_sentinel,local_40);
      iVar2 = (*local_40->_vptr_DeathTest[2])();
      if (iVar2 == 0) {
        iVar2 = (*local_40->_vptr_DeathTest[3])();
        bVar1 = testing::internal::ExitedUnsuccessfully(iVar2);
        uVar3 = (*local_40->_vptr_DeathTest[4])(local_40,(ulong)bVar1);
        if ((uVar3 & 1) != 0) goto LAB_00155c7a;
        local_a4 = 2;
      }
      else {
        if (iVar2 == 1) {
          testing::internal::DeathTest::ReturnSentinel::ReturnSentinel
                    ((ReturnSentinel *)&gtest_exception,local_40);
          bVar1 = testing::internal::AlwaysTrue();
          if (bVar1) {
            Span<const_int>::operator[]((Span<const_int> *)&gtest_dt,3);
          }
          (*local_40->_vptr_DeathTest[5])(local_40,2);
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel
                    ((ReturnSentinel *)&gtest_exception);
        }
LAB_00155c7a:
        local_a4 = 0;
      }
      std::
      unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>::
      ~unique_ptr((unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
                   *)&gtest_sentinel);
      if (local_a4 != 0) goto LAB_00155cb2;
    }
  }
  else {
LAB_00155cb2:
    testing::Message::Message(&local_b0);
    pcVar4 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt_1,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/span_test.cc"
               ,0x6b,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt_1,&local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt_1);
    testing::Message::~Message(&local_b0);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_1,(internal *)0x4e061d,regex_00);
    bVar1 = testing::internal::DeathTest::Create
                      ("span.subspan(4)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&gtest_dt_ptr_1,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/span_test.cc"
                       ,0x6c,&local_c0);
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_1);
    if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_0015610a;
    if (local_c0 != (pointer)0x0) {
      std::
      unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
      unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
                ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
                  *)&gtest_sentinel_1,local_c0);
      iVar2 = (*local_c0->_vptr_DeathTest[2])();
      if (iVar2 == 0) {
        iVar2 = (*local_c0->_vptr_DeathTest[3])();
        bVar1 = testing::internal::ExitedUnsuccessfully(iVar2);
        uVar3 = (*local_c0->_vptr_DeathTest[4])(local_c0,(ulong)bVar1);
        if ((uVar3 & 1) != 0) goto LAB_001560cc;
        local_a4 = 4;
      }
      else {
        if (iVar2 == 1) {
          testing::internal::DeathTest::ReturnSentinel::ReturnSentinel(&local_e8,local_c0);
          bVar1 = testing::internal::AlwaysTrue();
          SVar5.size_ = local_f0;
          SVar5.data_ = (int *)gtest_exception_1;
          if (bVar1) {
            SVar5 = Span<const_int>::subspan((Span<const_int> *)&gtest_dt,4,0xffffffffffffffff);
          }
          local_f0 = SVar5.size_;
          gtest_exception_1 = (exception *)SVar5.data_;
          (*local_c0->_vptr_DeathTest[5])(local_c0,2);
          local_a4 = 5;
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&local_e8);
        }
LAB_001560cc:
        local_a4 = 0;
      }
      std::
      unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>::
      ~unique_ptr((unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
                   *)&gtest_sentinel_1);
      if (local_a4 != 0) goto LAB_0015610a;
    }
  }
  else {
LAB_0015610a:
    testing::Message::Message(local_128);
    pcVar4 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt_2,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/span_test.cc"
               ,0x6c,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt_2,local_128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt_2);
    testing::Message::~Message(local_128);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_2,(internal *)0x4e061d,regex_01);
    bVar1 = testing::internal::DeathTest::Create
                      ("span.first(4)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&gtest_dt_ptr_2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/span_test.cc"
                       ,0x6d,&local_138);
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_2);
    if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_0015655b;
    if (local_138 != (pointer)0x0) {
      std::
      unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
      unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
                ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
                  *)&gtest_sentinel_2,local_138);
      iVar2 = (*local_138->_vptr_DeathTest[2])();
      if (iVar2 == 0) {
        iVar2 = (*local_138->_vptr_DeathTest[3])();
        bVar1 = testing::internal::ExitedUnsuccessfully(iVar2);
        uVar3 = (*local_138->_vptr_DeathTest[4])(local_138,(ulong)bVar1);
        if ((uVar3 & 1) != 0) goto LAB_0015651d;
        local_a4 = 6;
      }
      else {
        if (iVar2 == 1) {
          testing::internal::DeathTest::ReturnSentinel::ReturnSentinel(&local_160,local_138);
          bVar1 = testing::internal::AlwaysTrue();
          SVar6.size_ = local_168;
          SVar6.data_ = (int *)gtest_exception_2;
          if (bVar1) {
            SVar6 = Span<const_int>::first((Span<const_int> *)&gtest_dt,4);
          }
          local_168 = SVar6.size_;
          gtest_exception_2 = (exception *)SVar6.data_;
          (*local_138->_vptr_DeathTest[5])(local_138,2);
          local_a4 = 7;
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&local_160);
        }
LAB_0015651d:
        local_a4 = 0;
      }
      std::
      unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>::
      ~unique_ptr((unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
                   *)&gtest_sentinel_2);
      if (local_a4 != 0) goto LAB_0015655b;
    }
  }
  else {
LAB_0015655b:
    testing::Message::Message(local_1a0);
    pcVar4 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt_3,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/span_test.cc"
               ,0x6d,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt_3,local_1a0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt_3);
    testing::Message::~Message(local_1a0);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_3,(internal *)0x4e061d,regex_02);
    bVar1 = testing::internal::DeathTest::Create
                      ("span.last(4)",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&gtest_dt_ptr_3,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/span_test.cc"
                       ,0x6e,&local_1b0);
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_3);
    if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_001569ac;
    if (local_1b0 != (pointer)0x0) {
      std::
      unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
      unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
                ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
                  *)&gtest_sentinel_3,local_1b0);
      iVar2 = (*local_1b0->_vptr_DeathTest[2])();
      if (iVar2 == 0) {
        iVar2 = (*local_1b0->_vptr_DeathTest[3])();
        bVar1 = testing::internal::ExitedUnsuccessfully(iVar2);
        uVar3 = (*local_1b0->_vptr_DeathTest[4])(local_1b0,(ulong)bVar1);
        if ((uVar3 & 1) != 0) goto LAB_0015696e;
        local_a4 = 8;
      }
      else {
        if (iVar2 == 1) {
          testing::internal::DeathTest::ReturnSentinel::ReturnSentinel(&local_1d8,local_1b0);
          bVar1 = testing::internal::AlwaysTrue();
          SVar7.size_ = local_1e0;
          SVar7.data_ = (int *)gtest_exception_3;
          if (bVar1) {
            SVar7 = Span<const_int>::last((Span<const_int> *)&gtest_dt,4);
          }
          local_1e0 = SVar7.size_;
          gtest_exception_3 = (exception *)SVar7.data_;
          (*local_1b0->_vptr_DeathTest[5])(local_1b0,2);
          local_a4 = 9;
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel(&local_1d8);
        }
LAB_0015696e:
        local_a4 = 0;
      }
      std::
      unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>::
      ~unique_ptr((unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
                   *)&gtest_sentinel_3);
      if (local_a4 != 0) goto LAB_001569ac;
    }
  }
  else {
LAB_001569ac:
    testing::Message::Message(local_218);
    pcVar4 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&empty.size_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/span_test.cc"
               ,0x6e,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&empty.size_,local_218);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&empty.size_);
    testing::Message::~Message(local_218);
  }
  Span<const_int>::Span((Span<const_int> *)&gtest_dt_4,(int *)&span.size_,0);
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_4,(internal *)0x4e061d,regex_03);
    bVar1 = testing::internal::DeathTest::Create
                      ("empty[0]",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&gtest_dt_ptr_4,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/span_test.cc"
                       ,0x71,&local_238);
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_4);
    if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_00156de9;
    if (local_238 != (pointer)0x0) {
      std::
      unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
      unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
                ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
                  *)&gtest_sentinel_4,local_238);
      iVar2 = (*local_238->_vptr_DeathTest[2])();
      if (iVar2 == 0) {
        iVar2 = (*local_238->_vptr_DeathTest[3])();
        bVar1 = testing::internal::ExitedUnsuccessfully(iVar2);
        uVar3 = (*local_238->_vptr_DeathTest[4])(local_238,(ulong)bVar1);
        if ((uVar3 & 1) != 0) goto LAB_00156dab;
        local_a4 = 10;
      }
      else {
        if (iVar2 == 1) {
          testing::internal::DeathTest::ReturnSentinel::ReturnSentinel
                    ((ReturnSentinel *)&gtest_exception_4,local_238);
          bVar1 = testing::internal::AlwaysTrue();
          if (bVar1) {
            Span<const_int>::operator[]((Span<const_int> *)&gtest_dt_4,0);
          }
          (*local_238->_vptr_DeathTest[5])(local_238,2);
          local_a4 = 0xb;
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel
                    ((ReturnSentinel *)&gtest_exception_4);
        }
LAB_00156dab:
        local_a4 = 0;
      }
      std::
      unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>::
      ~unique_ptr((unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
                   *)&gtest_sentinel_4);
      if (local_a4 != 0) goto LAB_00156de9;
    }
  }
  else {
LAB_00156de9:
    testing::Message::Message(local_290);
    pcVar4 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt_5,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/span_test.cc"
               ,0x71,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt_5,local_290);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt_5);
    testing::Message::~Message(local_290);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    testing::internal::MakeDeathTestMatcher_abi_cxx11_
              ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_5,(internal *)0x4e061d,regex_04);
    bVar1 = testing::internal::DeathTest::Create
                      ("empty.front()",
                       (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                        *)&gtest_dt_ptr_5,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/span_test.cc"
                       ,0x72,&local_2a0);
    testing::
    Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
    ::~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                *)&gtest_dt_ptr_5);
    if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_0015720e;
    if (local_2a0 != (pointer)0x0) {
      std::
      unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
      unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
                ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
                  *)&gtest_sentinel_5,local_2a0);
      iVar2 = (*local_2a0->_vptr_DeathTest[2])();
      if (iVar2 == 0) {
        iVar2 = (*local_2a0->_vptr_DeathTest[3])();
        bVar1 = testing::internal::ExitedUnsuccessfully(iVar2);
        uVar3 = (*local_2a0->_vptr_DeathTest[4])(local_2a0,(ulong)bVar1);
        if ((uVar3 & 1) != 0) goto LAB_001571d0;
        local_a4 = 0xc;
      }
      else {
        if (iVar2 == 1) {
          testing::internal::DeathTest::ReturnSentinel::ReturnSentinel
                    ((ReturnSentinel *)&gtest_exception_5,local_2a0);
          bVar1 = testing::internal::AlwaysTrue();
          if (bVar1) {
            Span<const_int>::front((Span<const_int> *)&gtest_dt_4);
          }
          (*local_2a0->_vptr_DeathTest[5])(local_2a0,2);
          local_a4 = 0xd;
          testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel
                    ((ReturnSentinel *)&gtest_exception_5);
        }
LAB_001571d0:
        local_a4 = 0;
      }
      std::
      unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>::
      ~unique_ptr((unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
                   *)&gtest_sentinel_5);
      if (local_a4 != 0) goto LAB_0015720e;
    }
  }
  else {
LAB_0015720e:
    testing::Message::Message(local_2f8);
    pcVar4 = testing::internal::DeathTest::LastMessage();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_dt_6,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/span_test.cc"
               ,0x72,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_dt_6,local_2f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_dt_6);
    testing::Message::~Message(local_2f8);
  }
  bVar1 = testing::internal::AlwaysTrue();
  if (!bVar1) goto LAB_00157633;
  testing::internal::MakeDeathTestMatcher_abi_cxx11_
            ((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              *)&gtest_dt_ptr_6,(internal *)0x4e061d,regex_05);
  bVar1 = testing::internal::DeathTest::Create
                    ("empty.back()",
                     (Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                      *)&gtest_dt_ptr_6,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/span_test.cc"
                     ,0x73,&local_308);
  testing::
  Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>::
  ~Matcher((Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
            *)&gtest_dt_ptr_6);
  if (((bVar1 ^ 0xffU) & 1) != 0) goto LAB_00157633;
  if (local_308 == (pointer)0x0) {
    return;
  }
  std::unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>::
  unique_ptr<std::default_delete<testing::internal::DeathTest>,void>
            ((unique_ptr<testing::internal::DeathTest,std::default_delete<testing::internal::DeathTest>>
              *)&gtest_sentinel_6,local_308);
  iVar2 = (*local_308->_vptr_DeathTest[2])();
  if (iVar2 == 0) {
    iVar2 = (*local_308->_vptr_DeathTest[3])();
    bVar1 = testing::internal::ExitedUnsuccessfully(iVar2);
    uVar3 = (*local_308->_vptr_DeathTest[4])(local_308,(ulong)bVar1);
    if ((uVar3 & 1) != 0) goto LAB_001575f5;
    local_a4 = 0xe;
  }
  else {
    if (iVar2 == 1) {
      testing::internal::DeathTest::ReturnSentinel::ReturnSentinel
                ((ReturnSentinel *)&gtest_exception_6,local_308);
      bVar1 = testing::internal::AlwaysTrue();
      if (bVar1) {
        Span<const_int>::back((Span<const_int> *)&gtest_dt_4);
      }
      (*local_308->_vptr_DeathTest[5])(local_308,2);
      local_a4 = 0xf;
      testing::internal::DeathTest::ReturnSentinel::~ReturnSentinel
                ((ReturnSentinel *)&gtest_exception_6);
    }
LAB_001575f5:
    local_a4 = 0;
  }
  std::unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
  ::~unique_ptr((unique_ptr<testing::internal::DeathTest,_std::default_delete<testing::internal::DeathTest>_>
                 *)&gtest_sentinel_6);
  if (local_a4 == 0) {
    return;
  }
LAB_00157633:
  testing::Message::Message(local_360);
  pcVar4 = testing::internal::DeathTest::LastMessage();
  testing::internal::AssertHelper::AssertHelper
            (&local_368,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/span_test.cc"
             ,0x73,pcVar4);
  testing::internal::AssertHelper::operator=(&local_368,local_360);
  testing::internal::AssertHelper::~AssertHelper(&local_368);
  testing::Message::~Message(local_360);
  return;
}

Assistant:

TEST(SpanDeathTest, BoundsChecks) {
  // Make an array that's larger than we need, so that a failure to bounds check
  // won't crash.
  const int v[] = {1, 2, 3, 4};
  Span<const int> span(v, 3);
  // Out of bounds access.
  EXPECT_DEATH_IF_SUPPORTED(span[3], "");
  EXPECT_DEATH_IF_SUPPORTED(span.subspan(4), "");
  EXPECT_DEATH_IF_SUPPORTED(span.first(4), "");
  EXPECT_DEATH_IF_SUPPORTED(span.last(4), "");
  // Accessing an empty span.
  Span<const int> empty(v, 0);
  EXPECT_DEATH_IF_SUPPORTED(empty[0], "");
  EXPECT_DEATH_IF_SUPPORTED(empty.front(), "");
  EXPECT_DEATH_IF_SUPPORTED(empty.back(), "");
}